

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void __thiscall
google::protobuf::FileOptions::FileOptions(FileOptions *this,Arena *arena,bool is_message_owned)

{
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__MessageLite_004d46b0;
  internal::InternalMetadata::InternalMetadata
            (&(this->super_Message).super_MessageLite._internal_metadata_,arena,is_message_owned);
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__FileOptions_004d5648;
  internal::ExtensionSet::ExtensionSet(&this->_extensions_,arena);
  this->_has_bits_ = (uint32_t  [1])0x0;
  this->_cached_size_ = (atomic<int>)0x0;
  (this->uninterpreted_option_).super_RepeatedPtrFieldBase.arena_ = arena;
  (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->uninterpreted_option_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->uninterpreted_option_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  (this->java_package_).tagged_ptr_.ptr_ = &internal::fixed_address_empty_string_abi_cxx11_;
  (this->java_outer_classname_).tagged_ptr_.ptr_ = &internal::fixed_address_empty_string_abi_cxx11_;
  (this->go_package_).tagged_ptr_.ptr_ = &internal::fixed_address_empty_string_abi_cxx11_;
  (this->objc_class_prefix_).tagged_ptr_.ptr_ = &internal::fixed_address_empty_string_abi_cxx11_;
  (this->csharp_namespace_).tagged_ptr_.ptr_ = &internal::fixed_address_empty_string_abi_cxx11_;
  (this->swift_prefix_).tagged_ptr_.ptr_ = &internal::fixed_address_empty_string_abi_cxx11_;
  (this->php_class_prefix_).tagged_ptr_.ptr_ = &internal::fixed_address_empty_string_abi_cxx11_;
  (this->php_namespace_).tagged_ptr_.ptr_ = &internal::fixed_address_empty_string_abi_cxx11_;
  (this->php_metadata_namespace_).tagged_ptr_.ptr_ =
       &internal::fixed_address_empty_string_abi_cxx11_;
  (this->ruby_package_).tagged_ptr_.ptr_ = &internal::fixed_address_empty_string_abi_cxx11_;
  this->java_multiple_files_ = false;
  this->java_generate_equals_and_hash_ = false;
  this->java_string_check_utf8_ = false;
  this->cc_generic_services_ = false;
  this->java_generic_services_ = false;
  this->py_generic_services_ = false;
  this->php_generic_services_ = false;
  this->deprecated_ = false;
  this->optimize_for_ = 1;
  this->cc_enable_arenas_ = true;
  return;
}

Assistant:

FileOptions::FileOptions(::PROTOBUF_NAMESPACE_ID::Arena* arena,
                         bool is_message_owned)
  : ::PROTOBUF_NAMESPACE_ID::Message(arena, is_message_owned),
  _extensions_(arena),
  uninterpreted_option_(arena) {
  SharedCtor();
  if (!is_message_owned) {
    RegisterArenaDtor(arena);
  }
  // @@protoc_insertion_point(arena_constructor:google.protobuf.FileOptions)
}